

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseEqn.c
# Opt level: O1

Hop_Obj_t *
Parse_FormulaParserEqn(FILE *pOutput,char *pFormInit,Vec_Ptr_t *vVarNames,Hop_Man_t *pMan)

{
  byte bVar1;
  uint uVar2;
  void **ppvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  byte *__s;
  Parse_StackFn_t *p;
  Parse_StackOp_t *p_00;
  ulong uVar8;
  size_t sVar9;
  Hop_Obj_t *pHVar10;
  void *pvVar11;
  char cVar12;
  ulong uVar13;
  char *pcVar14;
  byte *__s1;
  char cVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  
  iVar4 = 0;
  pcVar14 = pFormInit;
  do {
    cVar15 = *pcVar14;
    if (cVar15 == '(') {
      iVar4 = iVar4 + 1;
    }
    else if (cVar15 == ')') {
      iVar4 = iVar4 + -1;
    }
    else if (cVar15 == '\0') goto LAB_0044a6b8;
    pcVar14 = pcVar14 + 1;
  } while( true );
LAB_0044aaa8:
  fwrite("Parse_FormulaParserEqn(): The negation sign or an opening parenthesis inside the variable name.\n"
         ,0x60,1,(FILE *)pOutput);
  bVar18 = false;
LAB_0044a947:
  uVar2 = vVarNames->nSize;
  uVar8 = (ulong)uVar2;
  bVar17 = 0 < (int)uVar2;
  if ((int)uVar2 < 1) {
    iVar4 = 0;
  }
  else {
    ppvVar3 = vVarNames->pArray;
    uVar13 = 0;
    do {
      pcVar14 = (char *)ppvVar3[uVar13];
      iVar4 = strncmp((char *)__s1,pcVar14,sVar7);
      if ((iVar4 == 0) && (sVar9 = strlen(pcVar14), sVar9 == sVar7)) {
        __s1 = __s1 + (lVar16 >> 0x20);
        uVar8 = uVar13;
        break;
      }
      uVar13 = uVar13 + 1;
      bVar17 = uVar13 < uVar8;
    } while (uVar8 != uVar13);
    iVar4 = (int)uVar8;
  }
  if (bVar17) {
    if (bVar18) {
      fprintf((FILE *)pOutput,
              "Parse_FormulaParserEqn(): The variable name \"%s\" follows another var without operation sign.\n"
              ,__s1);
      iVar4 = 4;
      cVar12 = '\x04';
    }
    else {
      pHVar10 = Hop_IthVar(pMan,iVar4);
      Parse_StackFnPush(p,pHVar10);
      iVar4 = 2;
      cVar12 = '\x02';
    }
  }
  else {
    fprintf((FILE *)pOutput,
            "Parse_FormulaParserEqn(): The parser cannot find var \"%s\" in the input var list.\n",
            __s1);
    iVar4 = 4;
    cVar12 = '\x04';
  }
LAB_0044a9f2:
  if (cVar12 != '\x01') {
    if (cVar12 == '\x02') {
      while (iVar5 = Parse_StackOpIsEmpty(p_00), iVar5 == 0) {
        iVar5 = Parse_StackOpPop(p_00);
        if (iVar5 != 10) goto LAB_0044aa8f;
        pvVar11 = Parse_StackFnPop(p);
        Parse_StackFnPush(p,(void *)((ulong)pvVar11 ^ 1));
      }
    }
    else {
      if (cVar12 == '\x04') goto LAB_0044abc6;
      while( true ) {
        iVar5 = Parse_StackOpPop(p_00);
        iVar6 = Parse_StackOpIsEmpty(p_00);
        if (iVar6 != 0) break;
        iVar6 = Parse_StackOpPop(p_00);
        if (iVar6 < iVar5) {
          Parse_StackOpPush(p_00,iVar6);
          break;
        }
        pHVar10 = Parse_ParserPerformTopOp(pMan,p,iVar6);
        if (pHVar10 == (Hop_Obj_t *)0x0) {
          fwrite("Parse_FormulaParserEqn(): Unknown operation\n",0x2c,1,(FILE *)pOutput);
          if (__s != (byte *)0x0) {
            free(__s);
          }
          Parse_StackFnFree(p);
          Parse_StackOpFree(p_00);
          return (Hop_Obj_t *)0x0;
        }
        Parse_StackOpPush(p_00,iVar5);
      }
LAB_0044aa8f:
      Parse_StackOpPush(p_00,iVar5);
    }
  }
LAB_0044aa9d:
  __s1 = __s1 + 1;
  cVar15 = cVar12;
  goto LAB_0044a741;
LAB_0044a6b8:
  if (iVar4 == 0) {
    sVar7 = strlen(pFormInit);
    __s = (byte *)malloc(sVar7 + 3);
    sprintf((char *)__s,"(%s)",pFormInit);
    p = Parse_StackFnStart(1000);
    p_00 = Parse_StackOpStart(1000);
    iVar4 = 1;
    __s1 = __s;
    cVar15 = '\x01';
LAB_0044a741:
    bVar1 = *__s1;
    cVar12 = cVar15;
    if (0x1f < bVar1) {
      switch(bVar1) {
      case 0x20:
        goto switchD_0044a766_caseD_20;
      case 0x21:
        if (cVar15 == '\x02') {
          Parse_StackOpPush(p_00,9);
          iVar4 = 3;
          cVar12 = '\x03';
        }
        Parse_StackOpPush(p_00,10);
        break;
      default:
        goto switchD_0044a766_caseD_22;
      case 0x28:
        if (cVar15 == '\x02') {
          sVar7 = 0x57;
          pcVar14 = 
          "Parse_FormulaParserEqn(): An opening parenthesis follows a var without operation sign.\n"
          ;
          goto LAB_0044a9df;
        }
        iVar4 = 1;
        cVar12 = '\x01';
        Parse_StackOpPush(p_00,1);
        break;
      case 0x29:
        iVar5 = Parse_StackOpIsEmpty(p_00);
        if (iVar5 == 0) {
          while (iVar5 = Parse_StackOpIsEmpty(p_00), iVar5 == 0) {
            iVar5 = Parse_StackOpPop(p_00);
            if (iVar5 == 1) {
              bVar18 = iVar4 == 4;
              iVar4 = (uint)bVar18 * 2 + 2;
              cVar12 = bVar18 * '\x02' + '\x02';
              goto LAB_0044a9f2;
            }
            pHVar10 = Parse_ParserPerformTopOp(pMan,p,iVar5);
            if (pHVar10 == (Hop_Obj_t *)0x0) {
              Parse_StackFnFree(p);
              Parse_StackOpFree(p_00);
              pcVar14 = "Parse_FormulaParserEqn(): Unknown operation\n";
              sVar7 = 0x2c;
              goto LAB_0044abe8;
            }
          }
        }
        sVar7 = 0x3a;
        pcVar14 = "Parse_FormulaParserEqn(): There is no opening parenthesis\n";
LAB_0044a9df:
        fwrite(pcVar14,sVar7,1,(FILE *)pOutput);
        iVar4 = 4;
        cVar12 = '\x04';
        break;
      case 0x2a:
      case 0x2b:
        if (cVar15 != '\x02') {
          sVar7 = 0x48;
          pcVar14 = "Parse_FormulaParserEqn(): There is no variable before AND, EXOR, or OR.\n";
          goto LAB_0044a9df;
        }
        if (bVar1 == 0x2a) {
          iVar4 = 9;
        }
        else {
          iVar4 = 7;
        }
        Parse_StackOpPush(p_00,iVar4);
        iVar4 = 3;
        cVar12 = '\x03';
        break;
      case 0x30:
        Parse_StackFnPush(p,(void *)((ulong)pMan->pConst1 ^ 1));
        iVar4 = 2;
        cVar12 = '\x02';
        if (cVar15 == '\x02') {
          sVar7 = 0x41;
          pcVar14 = "Parse_FormulaParserEqn(): No operation symbol before constant 0.\n";
          goto LAB_0044a9df;
        }
        break;
      case 0x31:
        Parse_StackFnPush(p,pMan->pConst1);
        iVar4 = 2;
        cVar12 = '\x02';
        if (cVar15 == '\x02') {
          sVar7 = 0x41;
          pcVar14 = "Parse_FormulaParserEqn(): No operation symbol before constant 1.\n";
          goto LAB_0044a9df;
        }
      }
      goto LAB_0044a9f2;
    }
    if ((bVar1 - 9 < 2) || (bVar1 == 0xd)) {
switchD_0044a766_caseD_20:
      goto LAB_0044aa9d;
    }
    if (bVar1 != 0) {
switchD_0044a766_caseD_22:
      lVar16 = -0x100000000;
      sVar7 = 0;
      do {
        uVar8 = (ulong)__s1[sVar7];
        if (uVar8 < 0x2c) {
          if ((0xe0100002601U >> (uVar8 & 0x3f) & 1) != 0) {
            bVar18 = cVar15 == '\x02';
            goto LAB_0044a947;
          }
          if ((0x10200000000U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_0044aaa8;
        }
        sVar7 = sVar7 + 1;
        lVar16 = lVar16 + 0x100000000;
      } while( true );
    }
LAB_0044abc6:
    if (cVar12 != '\x04') {
      iVar4 = Parse_StackFnIsEmpty(p);
      if (iVar4 == 0) {
        pHVar10 = (Hop_Obj_t *)Parse_StackFnPop(p);
        iVar4 = Parse_StackFnIsEmpty(p);
        if (iVar4 == 0) {
          pcVar14 = "Parse_FormulaParserEqn(): Something is left in the function stack\n";
          sVar7 = 0x42;
        }
        else {
          iVar4 = Parse_StackOpIsEmpty(p_00);
          if (iVar4 != 0) {
            Parse_StackFnFree(p);
            Parse_StackOpFree(p_00);
            if (__s != (byte *)0x0) {
              free(__s);
              return pHVar10;
            }
            return pHVar10;
          }
          pcVar14 = "Parse_FormulaParserEqn(): Something is left in the operation stack\n";
          sVar7 = 0x43;
        }
      }
      else {
        pcVar14 = "Parse_FormulaParserEqn(): The input string is empty\n";
        sVar7 = 0x34;
      }
LAB_0044abe8:
      fwrite(pcVar14,sVar7,1,(FILE *)pOutput);
    }
    if (__s != (byte *)0x0) {
      free(__s);
    }
  }
  else {
    fwrite("Parse_FormulaParserEqn(): Different number of opening and closing parentheses ().\n",
           0x52,1,(FILE *)pOutput);
  }
  return (Hop_Obj_t *)0x0;
}

Assistant:

Hop_Obj_t * Parse_FormulaParserEqn( FILE * pOutput, char * pFormInit, Vec_Ptr_t * vVarNames, Hop_Man_t * pMan )
{
    char * pFormula;
    Parse_StackFn_t * pStackFn;
    Parse_StackOp_t * pStackOp;
    Hop_Obj_t * gFunc;
    char * pTemp, * pName;
    int nParans, fFound, Flag;
	int Oper, Oper1, Oper2;
    int i, v;

    // make sure that the number of opening and closing parentheses is the same
    nParans = 0;
    for ( pTemp = pFormInit; *pTemp; pTemp++ )
        if ( *pTemp == '(' )
            nParans++;
        else if ( *pTemp == ')' )
            nParans--;
    if ( nParans != 0 )
    {
        fprintf( pOutput, "Parse_FormulaParserEqn(): Different number of opening and closing parentheses ().\n" );
        return NULL;
    }

    // copy the formula
    pFormula = ABC_ALLOC( char, strlen(pFormInit) + 3 );
    sprintf( pFormula, "(%s)", pFormInit );

    // start the stacks
    pStackFn = Parse_StackFnStart( PARSE_EQN_STACKSIZE );
    pStackOp = Parse_StackOpStart( PARSE_EQN_STACKSIZE );

    Flag = PARSE_EQN_FLAG_START;
    for ( pTemp = pFormula; *pTemp; pTemp++ )
	{
		switch ( *pTemp )
	    {
		// skip all spaces, tabs, and end-of-lines
        case ' ':
        case '\t':
        case '\r':
        case '\n':
			continue;
		case PARSE_EQN_SYM_CONST0:
		    Parse_StackFnPush( pStackFn, Hop_ManConst0(pMan) );  // Cudd_Ref( b0 );
			if ( Flag == PARSE_EQN_FLAG_VAR )
			{
				fprintf( pOutput, "Parse_FormulaParserEqn(): No operation symbol before constant 0.\n" );
				Flag = PARSE_EQN_FLAG_ERROR; 
                break;
			}
            Flag = PARSE_EQN_FLAG_VAR; 
            break;
		case PARSE_EQN_SYM_CONST1:
		    Parse_StackFnPush( pStackFn, Hop_ManConst1(pMan) );  //  Cudd_Ref( b1 );
			if ( Flag == PARSE_EQN_FLAG_VAR )
			{
				fprintf( pOutput, "Parse_FormulaParserEqn(): No operation symbol before constant 1.\n" );
				Flag = PARSE_EQN_FLAG_ERROR; 
                break;
			}
            Flag = PARSE_EQN_FLAG_VAR; 
            break;
		case PARSE_EQN_SYM_NEG:
			if ( Flag == PARSE_EQN_FLAG_VAR )
			{// if NEGBEF follows a variable, AND is assumed
				Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_AND );
				Flag = PARSE_EQN_FLAG_OPER;
			}
    		Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_NEG );
			break;
        case PARSE_EQN_SYM_AND:
        case PARSE_EQN_SYM_OR:
			if ( Flag != PARSE_EQN_FLAG_VAR )
			{
				fprintf( pOutput, "Parse_FormulaParserEqn(): There is no variable before AND, EXOR, or OR.\n" );
				Flag = PARSE_EQN_FLAG_ERROR; 
                break;
			}
			if ( *pTemp == PARSE_EQN_SYM_AND )
				Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_AND );
			else //if ( *pTemp == PARSE_EQN_SYM_OR )
				Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_OR );
			Flag = PARSE_EQN_FLAG_OPER; 
            break;
		case PARSE_EQN_SYM_OPEN:
			if ( Flag == PARSE_EQN_FLAG_VAR )
            {
//				Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_AND );
				fprintf( pOutput, "Parse_FormulaParserEqn(): An opening parenthesis follows a var without operation sign.\n" ); 
				Flag = PARSE_EQN_FLAG_ERROR; 
                break; 
            }
			Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_MARK );
			// after an opening bracket, it feels like starting over again
			Flag = PARSE_EQN_FLAG_START; 
            break;
		case PARSE_EQN_SYM_CLOSE:
			if ( !Parse_StackOpIsEmpty( pStackOp ) )
            {
				while ( 1 )
			    {
				    if ( Parse_StackOpIsEmpty( pStackOp ) )
					{
						fprintf( pOutput, "Parse_FormulaParserEqn(): There is no opening parenthesis\n" );
						Flag = PARSE_EQN_FLAG_ERROR; 
                        break;
					}
					Oper = Parse_StackOpPop( pStackOp );
					if ( Oper == PARSE_EQN_OPER_MARK )
						break;

                    // perform the given operation
                    if ( Parse_ParserPerformTopOp( pMan, pStackFn, Oper ) == NULL )
	                {
                        Parse_StackFnFree( pStackFn );
                        Parse_StackOpFree( pStackOp );
		                fprintf( pOutput, "Parse_FormulaParserEqn(): Unknown operation\n" );
                        ABC_FREE( pFormula );
		                return NULL;
	                }
			    }
            }
		    else
			{
				fprintf( pOutput, "Parse_FormulaParserEqn(): There is no opening parenthesis\n" );
				Flag = PARSE_EQN_FLAG_ERROR; 
                break;
			}
			if ( Flag != PARSE_EQN_FLAG_ERROR )
			    Flag = PARSE_EQN_FLAG_VAR; 
			break;


		default:
            // scan the next name
            for ( i = 0; pTemp[i] && 
                         pTemp[i] != ' ' && pTemp[i] != '\t' && pTemp[i] != '\r' && pTemp[i] != '\n' &&
                         pTemp[i] != PARSE_EQN_SYM_AND && pTemp[i] != PARSE_EQN_SYM_OR && pTemp[i] != PARSE_EQN_SYM_CLOSE; i++ )
              {
				    if ( pTemp[i] == PARSE_EQN_SYM_NEG || pTemp[i] == PARSE_EQN_SYM_OPEN )
				    {
					    fprintf( pOutput, "Parse_FormulaParserEqn(): The negation sign or an opening parenthesis inside the variable name.\n" );
					    Flag = PARSE_EQN_FLAG_ERROR; 
                        break;
				    }
              }
            // variable name is found
            fFound = 0;
            Vec_PtrForEachEntry( char *, vVarNames, pName, v )
                if ( strncmp(pTemp, pName, i) == 0 && strlen(pName) == (unsigned)i )
                {
                    pTemp += i-1;
                    fFound = 1;
                    break;
                }
            if ( !fFound )
			{ 
				fprintf( pOutput, "Parse_FormulaParserEqn(): The parser cannot find var \"%s\" in the input var list.\n", pTemp ); 
				Flag = PARSE_EQN_FLAG_ERROR; 
                break; 
			}
			if ( Flag == PARSE_EQN_FLAG_VAR )
            {
				fprintf( pOutput, "Parse_FormulaParserEqn(): The variable name \"%s\" follows another var without operation sign.\n", pTemp ); 
				Flag = PARSE_EQN_FLAG_ERROR; 
                break; 
            }
			Parse_StackFnPush( pStackFn, Hop_IthVar( pMan, v ) ); // Cudd_Ref( pbVars[v] );
            Flag = PARSE_EQN_FLAG_VAR; 
            break;
	    }

		if ( Flag == PARSE_EQN_FLAG_ERROR )
			break;      // error exit
		else if ( Flag == PARSE_EQN_FLAG_START )
			continue;  //  go on parsing
		else if ( Flag == PARSE_EQN_FLAG_VAR )
			while ( 1 )
			{  // check if there are negations in the OpStack     
				if ( Parse_StackOpIsEmpty(pStackOp) )
					break;
                Oper = Parse_StackOpPop( pStackOp );
				if ( Oper != PARSE_EQN_OPER_NEG )
                {
					Parse_StackOpPush( pStackOp, Oper );
					break;
                }
				else
				{
      				Parse_StackFnPush( pStackFn, Hop_Not((Hop_Obj_t *)Parse_StackFnPop(pStackFn)) );
				}
			}
		else // if ( Flag == PARSE_EQN_FLAG_OPER )
			while ( 1 )
			{  // execute all the operations in the OpStack
			   // with precedence higher or equal than the last one
				Oper1 = Parse_StackOpPop( pStackOp ); // the last operation
				if ( Parse_StackOpIsEmpty(pStackOp) ) 
				{  // if it is the only operation, push it back
					Parse_StackOpPush( pStackOp, Oper1 );
					break;
				}
				Oper2 = Parse_StackOpPop( pStackOp ); // the operation before the last one
				if ( Oper2 >= Oper1 )  
				{  // if Oper2 precedence is higher or equal, execute it
                    if ( Parse_ParserPerformTopOp( pMan, pStackFn, Oper2 ) == NULL )
	                {
		                fprintf( pOutput, "Parse_FormulaParserEqn(): Unknown operation\n" );
                        ABC_FREE( pFormula );
                        Parse_StackFnFree( pStackFn );
                        Parse_StackOpFree( pStackOp );
		                return NULL;
	                }
					Parse_StackOpPush( pStackOp,  Oper1 );     // push the last operation back
				}
				else
				{  // if Oper2 precedence is lower, push them back and done
					Parse_StackOpPush( pStackOp, Oper2 );
					Parse_StackOpPush( pStackOp, Oper1 );
					break;
				}
			}
    }

	if ( Flag != PARSE_EQN_FLAG_ERROR )
    {
		if ( !Parse_StackFnIsEmpty(pStackFn) )
	    {	
			gFunc = (Hop_Obj_t *)Parse_StackFnPop(pStackFn);
			if ( Parse_StackFnIsEmpty(pStackFn) )
				if ( Parse_StackOpIsEmpty(pStackOp) )
                {
                    Parse_StackFnFree(pStackFn);
                    Parse_StackOpFree(pStackOp);
//                    Cudd_Deref( gFunc );
                    ABC_FREE( pFormula );
					return gFunc;
                }
				else
					fprintf( pOutput, "Parse_FormulaParserEqn(): Something is left in the operation stack\n" );
			else
				fprintf( pOutput, "Parse_FormulaParserEqn(): Something is left in the function stack\n" );
	    }
	    else
			fprintf( pOutput, "Parse_FormulaParserEqn(): The input string is empty\n" );
    }
    ABC_FREE( pFormula );
	return NULL;
}